

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_find_cmp_chunk(void *chunk,void *aux,undefined1 **cmp_func_out,void **user_param_out)

{
  long lVar1;
  avl_node *paVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  kvs_node *node;
  kvs_node query;
  avl_node *a;
  filemgr *file;
  btreeblk_handle *bhandle;
  hbtrie *trie;
  fdb_kvs_id_t kv_id;
  fdb_kvs_id_t *in_stack_fffffffffffffee0;
  avl_cmp_func *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  avl_tree *in_stack_fffffffffffffef8;
  avl_node *local_28;
  
  lVar1 = *(long *)(*(long *)(in_RSI + 0x10) + 0x38);
  if (*(char *)(*(long *)(lVar1 + 0x170) + 0x28) == '\0') {
    *in_RDX = 0;
    *in_RCX = 0;
  }
  else {
    buf2kvid(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if (local_28 == (avl_node *)0x0) {
      *in_RDX = *(undefined8 *)(*(long *)(lVar1 + 0x170) + 8);
      *in_RCX = *(undefined8 *)(*(long *)(lVar1 + 0x170) + 0x10);
    }
    else {
      pthread_spin_lock((pthread_spinlock_t *)(*(long *)(lVar1 + 0x170) + 0x38));
      paVar2 = avl_search(in_stack_fffffffffffffef8,local_28,in_stack_fffffffffffffee8);
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar1 + 0x170) + 0x38));
      if (paVar2 == (avl_node *)0x0) {
        *in_RDX = 0;
        *in_RCX = 0;
      }
      else {
        *in_RDX = paVar2[-7].right;
        *in_RCX = paVar2[-6].parent;
      }
    }
  }
  return;
}

Assistant:

void fdb_kvs_find_cmp_chunk(void *chunk,
                            void *aux,
                            hbtrie_cmp_func** cmp_func_out,
                            void** user_param_out)
{
    fdb_kvs_id_t kv_id;
    struct hbtrie *trie = (struct hbtrie *)aux;
    struct btreeblk_handle *bhandle;
    struct filemgr *file;
    struct avl_node *a;
    struct kvs_node query, *node;

    bhandle = (struct btreeblk_handle*)trie->btreeblk_handle;
    file = bhandle->file;

    if (!file->kv_header->custom_cmp_enabled) {
        *cmp_func_out = NULL;
        *user_param_out = NULL;
        return;
    }

    buf2kvid(trie->chunksize, chunk, &kv_id);

    // search by id
    if (kv_id > 0) {
        query.id = kv_id;
        spin_lock(&file->kv_header->lock);
        a = avl_search(file->kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
        spin_unlock(&file->kv_header->lock);

        if (a) {
            node = _get_entry(a, struct kvs_node, avl_id);
            *cmp_func_out = (hbtrie_cmp_func *)node->custom_cmp;
            *user_param_out = node->user_param;
            return;
        }
    } else {
        // root handle
        *cmp_func_out = (hbtrie_cmp_func *)file->kv_header->default_kvs_cmp;
        *user_param_out = file->kv_header->default_kvs_cmp_param;
        return;
    }
    *cmp_func_out = NULL;
    *user_param_out = NULL;
    return;
}